

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

int __thiscall pstore::database::truncate(database *this,char *__file,__off_t __length)

{
  int extraout_EAX;
  
  if (this->closed_ != true) {
    this->modified_ = true;
    storage::map_bytes(&this->storage_,(this->size_).logical_,(uint64_t)__file);
    sizes::truncate_logical_size(&this->size_,(uint64_t)__file);
    storage::truncate_to_physical_size(&this->storage_);
    return extraout_EAX;
  }
  raise<pstore::error_code>(store_closed);
}

Assistant:

void database::truncate (std::uint64_t const size) {
        if (closed_) {
            raise (error_code::store_closed);
        }
        modified_ = true;

        // Adjust the memory mapped space if necessary.
        storage_.map_bytes (size_.logical_size (), size);

        size_.truncate_logical_size (size);

        if /*constexpr*/ (
            database::small_files_enabled ()) { //! OCLINT(PH - don't warn that this is a constant)
            this->file ()->truncate (size);
        } else {
            storage_.truncate_to_physical_size ();
        }
    }